

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbstrmatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::Clone
          (TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0x130);
  *(undefined ***)this_00 = &PTR__TPZSavable_019d8620;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19d84b8;
  *(undefined8 *)this_00 = 0x19d8580;
  *(undefined4 *)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  *(undefined1 *)((long)&this_00[1].fEquationFilter.fActiveEqs.fNAlloc + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019d7dd0,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x19d7ea8;
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19d7f88;
  TPZStructMatrixOT<std::complex<double>_>::TPZStructMatrixOT
            ((TPZStructMatrixOT<std::complex<double>_> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019d7df8,
             (TPZStructMatrixOT<std::complex<double>_> *)
             &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.field_0xa0
            );
  *(undefined8 *)this_00 = 0x19d7b88;
  this_00[1].fEquationFilter.fActiveEqs.fNElements = 0x19d7d50;
  *(undefined8 *)&this_00->field_0xa0 = 0x19d7c48;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZBandStructMatrix(*this);
}